

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChHexahedronFace.h
# Opt level: O3

shared_ptr<chrono::fea::ChNodeFEAxyz> __thiscall
chrono::fea::ChHexahedronFace::GetNodeN(ChHexahedronFace *this,int i)

{
  int *piVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  undefined4 in_register_00000034;
  long lVar2;
  long *plVar3;
  shared_ptr<chrono::fea::ChNodeFEAxyz> sVar4;
  
  lVar2 = CONCAT44(in_register_00000034,i);
  switch(*(undefined1 *)(lVar2 + 8)) {
  case 0:
    plVar3 = *(long **)(lVar2 + 0x10);
    piVar1 = GetNodeN::iface0;
    break;
  case 1:
    plVar3 = *(long **)(lVar2 + 0x10);
    piVar1 = GetNodeN::iface1;
    break;
  case 2:
    plVar3 = *(long **)(lVar2 + 0x10);
    piVar1 = GetNodeN::iface2;
    break;
  case 3:
    plVar3 = *(long **)(lVar2 + 0x10);
    piVar1 = GetNodeN::iface3;
    break;
  case 4:
    plVar3 = *(long **)(lVar2 + 0x10);
    piVar1 = GetNodeN::iface4;
    break;
  case 5:
    plVar3 = *(long **)(lVar2 + 0x10);
    piVar1 = GetNodeN::iface5;
    break;
  default:
    this->super_ChLoadableUV = (ChLoadableUV)0x0;
    *(undefined8 *)&this->m_face_id = 0;
    goto LAB_00633557;
  }
  (**(code **)(*plVar3 + 0x10))(this,plVar3,piVar1[(int)in_RDX._M_pi]);
  in_RDX._M_pi = extraout_RDX;
LAB_00633557:
  sVar4.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = in_RDX._M_pi;
  sVar4.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<chrono::fea::ChNodeFEAxyz>)
         sVar4.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ChNodeFEAxyz> GetNodeN(int i) const {
        static int iface0[] = {0, 3, 2, 1};
        static int iface1[] = {0, 1, 5, 4};
        static int iface2[] = {1, 2, 6, 5};
        static int iface3[] = {2, 3, 7, 6};
        static int iface4[] = {3, 0, 4, 7};
        static int iface5[] = {4, 5, 6, 7};

        switch (m_face_id) {
            case 0:
                return m_element->GetHexahedronNode(iface0[i]);
            case 1:
                return m_element->GetHexahedronNode(iface1[i]);
            case 2:
                return m_element->GetHexahedronNode(iface2[i]);
            case 3:
                return m_element->GetHexahedronNode(iface3[i]);
            case 4:
                return m_element->GetHexahedronNode(iface4[i]);
            case 5:
                return m_element->GetHexahedronNode(iface5[i]);
        }
        return nullptr;
    }